

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

_Bool upb_Array_Insert(upb_Array *arr,size_t i,size_t count,upb_Arena *arena)

{
  size_t sVar1;
  _Bool _Var2;
  size_t oldsize;
  upb_Arena *arena_local;
  size_t count_local;
  size_t i_local;
  upb_Array *arr_local;
  
  _Var2 = upb_Array_IsFrozen(arr);
  if (_Var2) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4d,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4e,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  if (arr->size_dont_copy_me__upb_internal_use_only < i) {
    __assert_fail("i <= arr->size_dont_copy_me__upb_internal_use_only",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4f,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  if (count + arr->size_dont_copy_me__upb_internal_use_only < count) {
    __assert_fail("count + arr->size_dont_copy_me__upb_internal_use_only >= count",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x50,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  sVar1 = arr->size_dont_copy_me__upb_internal_use_only;
  _Var2 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                    (arr,arr->size_dont_copy_me__upb_internal_use_only + count,arena);
  if (_Var2) {
    upb_Array_Move(arr,i + count,i,sVar1 - i);
  }
  return _Var2;
}

Assistant:

bool upb_Array_Insert(upb_Array* arr, size_t i, size_t count,
                      upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(arena);
  UPB_ASSERT(i <= arr->UPB_PRIVATE(size));
  UPB_ASSERT(count + arr->UPB_PRIVATE(size) >= count);
  const size_t oldsize = arr->UPB_PRIVATE(size);
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
          arr, arr->UPB_PRIVATE(size) + count, arena)) {
    return false;
  }
  upb_Array_Move(arr, i + count, i, oldsize - i);
  return true;
}